

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

string * fileContent(string *__return_storage_ptr__,string *filename)

{
  undefined8 uVar1;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ifstream fs;
  undefined8 auStack_130 [36];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter",&local_279)
  ;
  std::operator+(&local_258,&local_278,"/");
  std::operator+(&local_238,&local_258,filename);
  std::ifstream::ifstream(&fs,(string *)&local_238,_S_in);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(_fs + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
  std::ifstream::~ifstream(&fs);
  return __return_storage_ptr__;
}

Assistant:

std::string fileContent(const std::string & filename)
{
  std::ifstream fs(std::string(RESOURCE_DIR) + "/" + filename);
  std::string source(std::istreambuf_iterator<char>(fs), (std::istreambuf_iterator<char>()));
  return source;
}